

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void groupConcatValue(sqlite3_context *context)

{
  void *pvVar1;
  int n;
  char *z;
  
  pvVar1 = sqlite3_aggregate_context(context,0);
  if (pvVar1 == (void *)0x0) {
    return;
  }
  if (*(char *)((long)pvVar1 + 0x1c) != '\a') {
    if (*(char *)((long)pvVar1 + 0x1c) == '\x12') {
      sqlite3_result_error_toobig(context);
      return;
    }
    if ((ulong)*(uint *)((long)pvVar1 + 0x18) == 0) {
      n = 0;
      z = (char *)0x0;
    }
    else {
      *(undefined1 *)(*(long *)((long)pvVar1 + 8) + (ulong)*(uint *)((long)pvVar1 + 0x18)) = 0;
      z = *(char **)((long)pvVar1 + 8);
      n = *(int *)((long)pvVar1 + 0x18);
    }
    sqlite3_result_text(context,z,n,(_func_void_void_ptr *)0xffffffffffffffff);
    return;
  }
  sqlite3_result_error_nomem(context);
  return;
}

Assistant:

static void groupConcatValue(sqlite3_context *context){
  GroupConcatCtx *pGCC
    = (GroupConcatCtx*)sqlite3_aggregate_context(context, 0);
  if( pGCC ){
    StrAccum *pAccum = &pGCC->str;
    if( pAccum->accError==SQLITE_TOOBIG ){
      sqlite3_result_error_toobig(context);
    }else if( pAccum->accError==SQLITE_NOMEM ){
      sqlite3_result_error_nomem(context);
    }else{
      const char *zText = sqlite3_str_value(pAccum);
      sqlite3_result_text(context, zText, pAccum->nChar, SQLITE_TRANSIENT);
    }
  }
}